

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  int iVar1;
  ConvolutionLayerParams *pCVar2;
  Rep *pRVar3;
  Rep *pRVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ModelDescription *pMVar8;
  Type *pTVar9;
  FeatureType *pFVar10;
  ArrayFeatureType *pAVar11;
  NeuralNetwork *this;
  Type *pTVar12;
  long *plVar13;
  TensorAttributes *pTVar14;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar15;
  QuantizationParams *pQVar16;
  LinearQuantizationParams *pLVar17;
  ulong uVar18;
  long *plVar19;
  int iVar20;
  Model *pMVar21;
  undefined7 in_register_00000031;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  uint __val;
  long lVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  void **ppvVar26;
  string layerName;
  string output;
  string input;
  undefined1 local_108 [48];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined4 local_b4;
  TensorAttributes *local_b0;
  undefined8 local_a8;
  Model *local_a0;
  Type *local_98;
  uint local_90;
  undefined4 local_8c;
  NeuralNetwork *local_88;
  TensorAttributes local_80;
  long local_70;
  long lStack_68;
  TensorAttributes local_60;
  long local_50;
  long lStack_48;
  RepeatedPtrFieldBase *local_40;
  TensorAttributes *local_38;
  
  local_8c = CONCAT31(in_register_00000089,areWeightsQuantized);
  local_a8 = CONCAT44(in_register_00000084,numberOfLayers);
  local_b4 = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  local_b0 = inTensorAttr;
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    m->description_ = pMVar8;
  }
  pTVar14 = local_b0;
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(m->description_->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar9,pTVar14->name);
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  local_a0 = m;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar10->Type_).multiarraytype_;
  pAVar11->datatype_ = 0x10020;
  if (0 < local_b0->dimension) {
    iVar20 = 0;
    pTVar14 = local_b0;
    do {
      iVar1 = (pAVar11->shape_).total_size_;
      if ((pAVar11->shape_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar1 + 1);
        pTVar14 = local_b0;
      }
      iVar1 = (pAVar11->shape_).current_size_;
      (pAVar11->shape_).current_size_ = iVar1 + 1;
      ((pAVar11->shape_).rep_)->elements[iVar1] = 1;
      iVar20 = iVar20 + 1;
    } while (iVar20 < pTVar14->dimension);
  }
  pMVar21 = local_a0;
  if (local_a0->description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    pMVar21->description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar21->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar9,outTensorAttr->name);
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar10->Type_).multiarraytype_;
  pAVar11->datatype_ = 0x10020;
  if (0 < outTensorAttr->dimension) {
    iVar20 = 0;
    do {
      iVar1 = (pAVar11->shape_).total_size_;
      if ((pAVar11->shape_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar1 + 1);
      }
      iVar1 = (pAVar11->shape_).current_size_;
      (pAVar11->shape_).current_size_ = iVar1 + 1;
      ((pAVar11->shape_).rep_)->elements[iVar1] = 1;
      iVar20 = iVar20 + 1;
    } while (iVar20 < outTensorAttr->dimension);
  }
  pMVar21 = local_a0;
  local_a0->specificationversion_ = 4;
  if (local_a0->_oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(local_a0);
    pMVar21->_oneof_case_[0] = 500;
    this = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this);
    (pMVar21->Type_).neuralnetwork_ = this;
  }
  local_88 = (NeuralNetwork *)(pMVar21->Type_).pipelineclassifier_;
  local_38 = outTensorAttr;
  if (0 < (int)(uint)local_a8) {
    local_40 = &(local_88->layers_).super_RepeatedPtrFieldBase;
    local_90 = (uint)local_a8 - 1;
    __val = 0;
    do {
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (local_40,(Type *)0x0);
      uVar24 = 1;
      if (9 < __val) {
        uVar18 = (ulong)__val;
        uVar5 = 4;
        do {
          uVar24 = uVar5;
          uVar25 = (uint)uVar18;
          if (uVar25 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001bc8e8;
          }
          if (uVar25 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001bc8e8;
          }
          if (uVar25 < 10000) goto LAB_001bc8e8;
          uVar18 = uVar18 / 10000;
          uVar5 = uVar24 + 4;
        } while (99999 < uVar25);
        uVar24 = uVar24 + 1;
      }
LAB_001bc8e8:
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_108,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108._0_8_,uVar24,__val);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)local_108,0,(char *)0x0,0x3035d9);
      local_d8 = &local_c8;
      plVar19 = plVar13 + 2;
      if ((long *)*plVar13 == plVar19) {
        local_c8 = *plVar19;
        lStack_c0 = plVar13[3];
      }
      else {
        local_c8 = *plVar19;
        local_d8 = (long *)*plVar13;
      }
      local_d0 = plVar13[1];
      *plVar13 = (long)plVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      uVar24 = __val - 1;
      uVar5 = -uVar24;
      if (0 < (int)uVar24) {
        uVar5 = uVar24;
      }
      uVar25 = 1;
      if (9 < uVar5) {
        uVar18 = (ulong)uVar5;
        uVar6 = 4;
        do {
          uVar25 = uVar6;
          uVar7 = (uint)uVar18;
          if (uVar7 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_001bc9ed;
          }
          if (uVar7 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_001bc9ed;
          }
          if (uVar7 < 10000) goto LAB_001bc9ed;
          uVar18 = uVar18 / 10000;
          uVar6 = uVar25 + 4;
        } while (99999 < uVar7);
        uVar25 = uVar25 + 1;
      }
LAB_001bc9ed:
      local_108._0_8_ = local_108 + 0x10;
      local_98 = pTVar12;
      std::__cxx11::string::_M_construct
                ((ulong)local_108,(char)uVar25 - (char)((int)uVar24 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_108._0_8_ + (ulong)(uVar24 >> 0x1f)),uVar25,uVar5);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)local_108,0,(char *)0x0,0x324753);
      local_60.name = (char *)&local_50;
      plVar19 = plVar13 + 2;
      if ((long *)*plVar13 == plVar19) {
        local_50 = *plVar19;
        lStack_48 = plVar13[3];
      }
      else {
        local_50 = *plVar19;
        local_60.name = (char *)*plVar13;
      }
      local_60._8_8_ = plVar13[1];
      *plVar13 = (long)plVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      uVar24 = 1;
      if (9 < __val) {
        uVar18 = (ulong)__val;
        uVar5 = 4;
        do {
          uVar24 = uVar5;
          uVar25 = (uint)uVar18;
          if (uVar25 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001bcb01;
          }
          if (uVar25 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001bcb01;
          }
          if (uVar25 < 10000) goto LAB_001bcb01;
          uVar18 = uVar18 / 10000;
          uVar5 = uVar24 + 4;
        } while (99999 < uVar25);
        uVar24 = uVar24 + 1;
      }
LAB_001bcb01:
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_108,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108._0_8_,uVar24,__val);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)local_108,0,(char *)0x0,0x324753);
      pTVar12 = local_98;
      local_80.name = (char *)&local_70;
      plVar19 = plVar13 + 2;
      if ((long *)*plVar13 == plVar19) {
        local_70 = *plVar19;
        lStack_68 = plVar13[3];
      }
      else {
        local_70 = *plVar19;
        local_80.name = (char *)*plVar13;
      }
      local_80._8_8_ = plVar13[1];
      *plVar13 = (long)plVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      plVar13 = (long *)"inner_layer";
      if ((uint)local_a8 != 1) {
        plVar13 = local_d8;
      }
      CoreML::Specification::NeuralNetworkLayer::set_name(pTVar12,(char *)plVar13);
      pTVar14 = &local_60;
      if (__val == 0) {
        pTVar14 = local_b0;
      }
      CoreML::Specification::NeuralNetworkLayer::add_input(pTVar12,pTVar14->name);
      pTVar14 = &local_80;
      if (__val == local_90) {
        pTVar14 = local_38;
      }
      CoreML::Specification::NeuralNetworkLayer::add_output(pTVar12,pTVar14->name);
      if (pTVar12->_oneof_case_[0] != 0x8c) {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar12);
        pTVar12->_oneof_case_[0] = 0x8c;
        this_00 = (InnerProductLayerParams *)operator_new(0x38);
        CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_00);
        (pTVar12->layer_).innerproduct_ = this_00;
      }
      pCVar2 = (pTVar12->layer_).convolution_;
      *(undefined8 *)&pCVar2->_kernelsize_cached_byte_size_ = 1;
      (pCVar2->stride_).current_size_ = 1;
      (pCVar2->stride_).total_size_ = 0;
      lVar22._0_4_ = (pCVar2->kernelsize_).current_size_;
      lVar22._4_4_ = (pCVar2->kernelsize_).total_size_;
      if (lVar22 == 0) {
        pWVar15 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar15);
        *(WeightParams **)&pCVar2->kernelsize_ = pWVar15;
      }
      lVar22 = *(long *)&pCVar2->kernelsize_;
      if ((char)local_8c == '\0') {
        if (*(int *)(lVar22 + 0x10) == *(int *)(lVar22 + 0x14)) {
          google::protobuf::RepeatedField<float>::Reserve
                    ((RepeatedField<float> *)(lVar22 + 0x10),*(int *)(lVar22 + 0x14) + 1);
        }
        iVar20 = *(int *)(lVar22 + 0x10);
        *(int *)(lVar22 + 0x10) = iVar20 + 1;
        *(undefined4 *)(*(long *)(lVar22 + 0x18) + 8 + (long)iVar20 * 4) = 0x3f800000;
      }
      else {
        if (*(long *)(lVar22 + 0x40) == 0) {
          pQVar16 = (QuantizationParams *)operator_new(0x28);
          CoreML::Specification::QuantizationParams::QuantizationParams(pQVar16);
          *(QuantizationParams **)(lVar22 + 0x40) = pQVar16;
        }
        pQVar16 = *(QuantizationParams **)(lVar22 + 0x40);
        pQVar16->numberofbits_ = 1;
        if (pQVar16->_oneof_case_[0] != 0x65) {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar16);
          pQVar16->_oneof_case_[0] = 0x65;
          pLVar17 = (LinearQuantizationParams *)operator_new(0x40);
          CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar17);
          (pQVar16->QuantizationType_).linearquantization_ = pLVar17;
        }
        pLVar17 = (pQVar16->QuantizationType_).linearquantization_;
        iVar20 = (pLVar17->scale_).total_size_;
        if ((pLVar17->scale_).current_size_ == iVar20) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar17->scale_,iVar20 + 1);
        }
        iVar20 = (pLVar17->scale_).current_size_;
        (pLVar17->scale_).current_size_ = iVar20 + 1;
        ((pLVar17->scale_).rep_)->elements[iVar20] = 1.0;
        iVar20 = (pLVar17->bias_).total_size_;
        if ((pLVar17->bias_).current_size_ == iVar20) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar17->bias_,iVar20 + 1);
        }
        iVar20 = (pLVar17->bias_).current_size_;
        (pLVar17->bias_).current_size_ = iVar20 + 1;
        ((pLVar17->bias_).rep_)->elements[iVar20] = 0.0;
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"x01","");
        google::protobuf::internal::ArenaStringPtr::SetNoArena
                  ((ArenaStringPtr *)(lVar22 + 0x38),
                   (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                   (string *)local_108);
        pTVar12 = local_98;
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
      }
      *(undefined1 *)&(pCVar2->stride_).rep_ = 1;
      if ((pCVar2->kernelsize_).rep_ == (Rep *)0x0) {
        pWVar15 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar15);
        (pCVar2->kernelsize_).rep_ = (Rep *)pWVar15;
      }
      pRVar3 = (pCVar2->kernelsize_).rep_;
      if (isBiasQuantized) {
        if (pRVar3[4].arena == (Arena *)0x0) {
          pQVar16 = (QuantizationParams *)operator_new(0x28);
          CoreML::Specification::QuantizationParams::QuantizationParams(pQVar16);
          pRVar3[4].arena = (Arena *)pQVar16;
        }
        pQVar16 = (QuantizationParams *)pRVar3[4].arena;
        pQVar16->numberofbits_ = 1;
        if (pQVar16->_oneof_case_[0] != 0x65) {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar16);
          pQVar16->_oneof_case_[0] = 0x65;
          pLVar17 = (LinearQuantizationParams *)operator_new(0x40);
          CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar17);
          (pQVar16->QuantizationType_).linearquantization_ = pLVar17;
        }
        pLVar17 = (pQVar16->QuantizationType_).linearquantization_;
        iVar20 = (pLVar17->scale_).total_size_;
        if ((pLVar17->scale_).current_size_ == iVar20) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar17->scale_,iVar20 + 1);
        }
        iVar20 = (pLVar17->scale_).current_size_;
        (pLVar17->scale_).current_size_ = iVar20 + 1;
        ((pLVar17->scale_).rep_)->elements[iVar20] = 1.0;
        iVar20 = (pLVar17->bias_).total_size_;
        if ((pLVar17->bias_).current_size_ == iVar20) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar17->bias_,iVar20 + 1);
        }
        iVar20 = (pLVar17->bias_).current_size_;
        (pLVar17->bias_).current_size_ = iVar20 + 1;
        ((pLVar17->bias_).rep_)->elements[iVar20] = 0.0;
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"x01","");
        google::protobuf::internal::ArenaStringPtr::SetNoArena
                  ((ArenaStringPtr *)pRVar3[3].elements,
                   (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                   (string *)local_108);
        pTVar12 = local_98;
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
      }
      else {
        iVar20 = *(int *)((long)&pRVar3[1].arena + 4);
        if (*(int *)&pRVar3[1].arena == iVar20) {
          google::protobuf::RepeatedField<float>::Reserve
                    ((RepeatedField<float> *)(pRVar3 + 1),iVar20 + 1);
        }
        iVar20 = *(int *)&pRVar3[1].arena;
        *(int *)&pRVar3[1].arena = iVar20 + 1;
        *(undefined4 *)(pRVar3[1].elements[0] + 8 + (long)iVar20 * 4) = 0x3f800000;
      }
      if ((char)local_b4 != '\0') {
        pTVar12->isupdatable_ = true;
        lVar23._0_4_ = (pCVar2->kernelsize_).current_size_;
        lVar23._4_4_ = (pCVar2->kernelsize_).total_size_;
        if (lVar23 == 0) {
          pWVar15 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar15);
          *(WeightParams **)&pCVar2->kernelsize_ = pWVar15;
        }
        *(undefined1 *)(*(long *)&pCVar2->kernelsize_ + 0x48) = 1;
        if ((pCVar2->kernelsize_).rep_ == (Rep *)0x0) {
          pWVar15 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar15);
          (pCVar2->kernelsize_).rep_ = (Rep *)pWVar15;
        }
        *(undefined1 *)(pCVar2->kernelsize_).rep_[4].elements = 1;
      }
      if ((long *)local_80.name != &local_70) {
        operator_delete(local_80.name,local_70 + 1);
      }
      pMVar21 = local_a0;
      if ((long *)local_60.name != &local_50) {
        operator_delete(local_60.name,local_50 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      __val = __val + 1;
    } while (__val != (uint)local_a8);
  }
  if ((char)local_b4 != '\0') {
    pMVar21->isupdatable_ = true;
    pMVar8 = pMVar21->description_;
    if (pMVar8 == (ModelDescription *)0x0) {
      pMVar8 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar4 = (pMVar8->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar26 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar26 = (void **)0x0;
    }
    lVar22 = (long)(pMVar8->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar22 != 0) {
      lVar23 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_108,*(FeatureDescription **)((long)ppvVar26 + lVar23)
                  );
        if (pMVar21->description_ == (ModelDescription *)0x0) {
          pMVar8 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
          pMVar21->description_ = pMVar8;
        }
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(pMVar21->description_->traininginput_).super_RepeatedPtrFieldBase,
                            (Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar9,(FeatureDescription *)local_108);
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_108);
        lVar23 = lVar23 + 8;
      } while (lVar22 * 8 != lVar23);
    }
  }
  return local_88;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}